

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int thread_tcache_flush_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  int iVar1;
  
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) {
    iVar1 = 1;
    if ((newp == (void *)0x0 && newlen == 0) && (oldp == (void *)0x0 && oldlenp == (size_t *)0x0)) {
      tcache_flush(tsd);
      iVar1 = 0;
    }
    return iVar1;
  }
  return 0xe;
}

Assistant:

static int
tcache_flush_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned tcache_ind;

	WRITEONLY();
	tcache_ind = UINT_MAX;
	WRITE(tcache_ind, unsigned);
	if (tcache_ind == UINT_MAX) {
		ret = EFAULT;
		goto label_return;
	}
	tcaches_flush(tsd, tcache_ind);

	ret = 0;
label_return:
	return ret;
}